

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

int __thiscall QUrlQueryPrivate::findRecodedKey(QUrlQueryPrivate *this,QString *key,int from)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)from;
  lVar3 = lVar4 * 0x30;
  while ((lVar2 = (this->itemList).d.size, lVar4 < lVar2 &&
         (bVar1 = ::comparesEqual((QString *)((long)&(((this->itemList).d.ptr)->first).d.d + lVar3),
                                  key), lVar2 = lVar4, !bVar1))) {
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x30;
  }
  return (int)lVar2;
}

Assistant:

int findRecodedKey(const QString &key, int from = 0) const
    {
        for (int i = from; i < itemList.size(); ++i)
            if (itemList.at(i).first == key)
                return i;
        return itemList.size();
    }